

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_revnspn(char *s,char *n,size_t len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  
  lVar1 = len - 1;
  lVar4 = lVar1;
  pcVar5 = n;
  lVar2 = -1;
  if (lVar1 < -1) {
    lVar2 = lVar1;
  }
  while ((lVar3 = lVar2, -1 < lVar4 && (lVar3 = lVar4, pcVar6 = n, *pcVar5 != '\0'))) {
    for (; (*pcVar6 != '\0' && (s[lVar4] != *pcVar6)); pcVar6 = pcVar6 + 1) {
    }
    lVar4 = lVar4 + -1;
    pcVar5 = pcVar6;
  }
  return lVar1 - lVar3;
}

Assistant:

size_t coda_revnspn(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x = n;

	for (; p > b && *x; --p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) break;
		}
	}

	return s - 1 + len - p;
}